

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

int lyb_read(char *data,uint8_t *buf,size_t count,lyb_state *lybs)

{
  uint8_t uVar1;
  size_t *psVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  
  if ((data != (char *)0x0) && (lybs != (lyb_state *)0x0)) {
    iVar8 = 0;
    while( true ) {
      uVar4 = lybs->used;
      uVar7 = count;
      if ((long)(int)uVar4 < 1) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar6 = 0xffffffff;
        uVar3 = 0;
        do {
          if ((lybs->written[uVar3] <= uVar7) && (lybs->position[uVar3] != 0)) {
            uVar6 = uVar3 & 0xffffffff;
            uVar7 = lybs->written[uVar3];
          }
          uVar5 = (uint)uVar6;
          uVar3 = uVar3 + 1;
        } while ((long)(int)uVar4 != uVar3);
      }
      if ((uVar5 == 0xffffffff) && (count == 0)) break;
      if (uVar7 != 0) {
        if (buf != (uint8_t *)0x0) {
          memcpy(buf,data + iVar8,uVar7);
          uVar4 = lybs->used;
        }
        if (0 < (int)uVar4) {
          psVar2 = lybs->written;
          uVar3 = 0;
          do {
            uVar6 = psVar2[uVar3] - uVar7;
            psVar2[uVar3] = uVar6;
            if (0xff < uVar6) {
              __assert_fail("lybs->written[i] <= LYB_SIZE_MAX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                            ,0x52,
                            "int lyb_read(const char *, uint8_t *, size_t, struct lyb_state *)");
            }
            uVar3 = uVar3 + 1;
          } while (uVar4 != uVar3);
        }
        count = count - uVar7;
        if (buf != (uint8_t *)0x0) {
          buf = buf + uVar7;
        }
        iVar8 = iVar8 + (int)uVar7;
      }
      if (-1 < (int)uVar5) {
        uVar1 = data[(long)iVar8 + 1];
        lybs->written[uVar5] = (ulong)(byte)data[iVar8];
        lybs->inner_chunks[uVar5] = uVar1;
        lybs->position[uVar5] = (ulong)(lybs->written[uVar5] == 0xff);
        iVar8 = iVar8 + 2;
      }
    }
    return iVar8;
  }
  __assert_fail("data && lybs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                ,0x35,"int lyb_read(const char *, uint8_t *, size_t, struct lyb_state *)");
}

Assistant:

static int
lyb_read(const char *data, uint8_t *buf, size_t count, struct lyb_state *lybs)
{
    int ret = 0, i, empty_chunk_i;
    size_t to_read;
    uint8_t meta_buf[LYB_META_BYTES];

    assert(data && lybs);

    while (1) {
        /* check for fully-read (empty) data chunks */
        to_read = count;
        empty_chunk_i = -1;
        for (i = 0; i < lybs->used; ++i) {
            /* we want the innermost chunks resolved first, so replace previous empty chunks,
             * also ignore chunks that are completely finished, there is nothing for us to do */
            if ((lybs->written[i] <= to_read) && lybs->position[i]) {
                /* empty chunk, do not read more */
                to_read = lybs->written[i];
                empty_chunk_i = i;
            }
        }

        if ((empty_chunk_i == -1) && !count) {
            break;
        }

        /* we are actually reading some data, not just finishing another chunk */
        if (to_read) {
            if (buf) {
                memcpy(buf, data + ret, to_read);
            }

            for (i = 0; i < lybs->used; ++i) {
                /* decrease all written counters */
                lybs->written[i] -= to_read;
                assert(lybs->written[i] <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= to_read;
            if (buf) {
                buf += to_read;
            }

            ret += to_read;
        }

        if (empty_chunk_i > -1) {
            /* read the next chunk meta information */
            memcpy(meta_buf, data + ret, LYB_META_BYTES);
            lybs->written[empty_chunk_i] = meta_buf[0];
            lybs->inner_chunks[empty_chunk_i] = meta_buf[1];

            /* remember whether there is a following chunk or not */
            lybs->position[empty_chunk_i] = (lybs->written[empty_chunk_i] == LYB_SIZE_MAX ? 1 : 0);

            ret += LYB_META_BYTES;
        }
    }

    return ret;
}